

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

void __thiscall ot::commissioner::JoinerSession::HandleConnect(JoinerSession *this,Error *aError)

{
  CommissionerHandler *pCVar1;
  undefined1 local_40 [40];
  
  pCVar1 = this->mCommImpl->mCommissionerHandler;
  Error::Error((Error *)local_40,aError);
  (*pCVar1->_vptr_CommissionerHandler[1])(pCVar1,&this->mJoinerId,(Error *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return;
}

Assistant:

void JoinerSession::HandleConnect(Error aError)
{
    mCommImpl.mCommissionerHandler.OnJoinerConnected(mJoinerId, aError);
}